

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.periodic.c
# Opt level: O1

void pnga_periodic(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld,void *alpha,
                  Integer op_code)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  byte bVar7;
  long lVar8;
  int *piVar9;
  int iVar10;
  undefined1 (*pauVar11) [16];
  long lVar12;
  long lVar13;
  long lVar14;
  undefined1 (*pauVar15) [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Integer ndim;
  Integer type;
  int counter [7];
  Integer hip [7];
  Integer range_num [7];
  Integer dims [7];
  Integer offset [7] [3];
  Integer range [7] [6];
  Integer lop [7];
  long local_540;
  long local_538;
  void *local_530;
  undefined8 local_528;
  Integer local_4e8 [8];
  long alStack_4a8 [8];
  Integer local_468 [8];
  long alStack_428 [22];
  long alStack_378 [42];
  Integer local_228 [8];
  int local_1e8 [110];
  
  local_530 = alpha;
  pnga_inquire(g_a,&local_538,&local_540,local_468);
  bVar6 = true;
  if (0 < local_540) {
    iVar10 = 0;
    lVar12 = 0;
    do {
      lVar13 = lo[lVar12];
      local_4e8[lVar12] = lVar13;
      lVar14 = hi[lVar12];
      (&local_528)[lVar12] = lVar14;
      lVar14 = lVar14 - lVar13;
      if ((lVar14 < 0) ||
         (SBORROW8(lVar14,local_468[lVar12] * 2) == lVar14 + local_468[lVar12] * -2 < 0))
      goto LAB_0011c44e;
      lVar12 = lVar12 + 1;
    } while (local_540 != lVar12);
    if (0 < local_540) {
      bVar6 = true;
      lVar12 = 0;
      do {
        lVar13 = local_4e8[lVar12];
        lVar14 = local_468[lVar12];
        if (lVar14 < lVar13) {
          (&local_528)[lVar12] = (&local_528)[lVar12] - (lVar13 / lVar14) * lVar14;
          local_4e8[lVar12] = lVar13 % lVar14;
          if (lVar13 / lVar14 != 0) {
            bVar6 = false;
          }
        }
        lVar13 = (&local_528)[lVar12];
        if (lVar13 < 1) {
          lVar8 = lVar13 / lVar14 + 1;
          if (lVar8 != 0) {
            bVar6 = false;
          }
          lVar8 = lVar8 * lVar14;
          local_4e8[lVar12] = local_4e8[lVar12] + lVar8;
          (&local_528)[lVar12] = lVar8 + lVar13;
        }
        lVar12 = lVar12 + 1;
      } while (local_540 != lVar12);
    }
  }
  if (0 < local_540) {
    pauVar11 = (undefined1 (*) [16])local_228;
    lVar12 = 0;
    do {
      *(undefined4 *)pauVar11[1] = 0;
      *pauVar11 = (undefined1  [16])0x0;
      *(undefined8 *)(pauVar11[1] + 8) = 1;
      lVar13 = local_468[lVar12];
      *(long *)pauVar11[2] = lVar13;
      *(undefined4 *)(pauVar11[2] + 8) = 0;
      *(long *)pauVar11[3] = lVar13 + 1;
      *(undefined8 *)(pauVar11[3] + 8) = 0;
      *(undefined4 *)pauVar11[4] = 0;
      lVar14 = local_4e8[lVar12];
      pauVar15 = (undefined1 (*) [16])(pauVar11[1] + 8);
      if (lVar14 < 1) {
        pauVar15 = pauVar11;
      }
      *(long *)*pauVar15 = lVar14;
      pauVar15 = pauVar11 + 1;
      if (0 < lVar14) {
        pauVar15 = (undefined1 (*) [16])(pauVar11[2] + 8);
      }
      *(undefined4 *)*pauVar15 = 1;
      if ((lVar14 < 1) && (lVar13 < (long)(&local_528)[lVar12])) {
        *(undefined4 *)(pauVar11[2] + 8) = 1;
      }
      lVar14 = (&local_528)[lVar12];
      pauVar15 = pauVar11 + 2;
      if (lVar13 < lVar14) {
        pauVar15 = (undefined1 (*) [16])(pauVar11[3] + 8);
      }
      *(long *)*pauVar15 = lVar14;
      pauVar15 = (undefined1 (*) [16])(pauVar11[2] + 8);
      if (lVar13 < lVar14) {
        pauVar15 = pauVar11 + 4;
      }
      *(undefined4 *)*pauVar15 = 1;
      lVar12 = lVar12 + 1;
      pauVar11 = (undefined1 (*) [16])(pauVar11[4] + 8);
    } while (local_540 != lVar12);
    if (0 < local_540) {
      bVar7 = 1;
      piVar9 = local_1e8;
      lVar12 = local_540;
      do {
        if ((piVar9[-0xc] != 0) || (*piVar9 != 0)) {
          bVar7 = 0;
        }
        piVar9 = piVar9 + 0x12;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      bVar6 = (bool)(bVar6 & bVar7);
    }
  }
  iVar10 = 1;
  if (bVar6) {
    iVar10 = 100;
  }
  if ((0 < local_540) && (!bVar6)) {
    piVar9 = local_1e8;
    lVar12 = 0;
    lVar13 = 0;
    do {
      alStack_4a8[lVar13] = 0;
      if (piVar9[-0xc] != 0) {
        lVar8 = *(long *)(piVar9 + -0x10);
        lVar3 = *(long *)(piVar9 + -0xe);
        lVar14 = local_468[lVar13];
        auVar16._8_4_ = (int)lVar14;
        auVar16._0_8_ = lVar14;
        auVar16._12_4_ = (int)((ulong)lVar14 >> 0x20);
        *(long *)((long)alStack_378 + lVar12 * 2) = lVar14 + *(long *)(piVar9 + -0x10);
        *(long *)((long)alStack_378 + lVar12 * 2 + 8) = auVar16._8_8_ + lVar3;
        *(long *)((long)alStack_428 + lVar12) = lVar8 - local_4e8[lVar13];
        alStack_4a8[lVar13] = 1;
      }
      if (piVar9[-6] != 0) {
        lVar14 = alStack_4a8[lVar13];
        lVar8 = *(long *)(piVar9 + -10);
        uVar5 = *(undefined8 *)(piVar9 + -8);
        puVar1 = (undefined8 *)((long)alStack_378 + lVar12 * 2 + lVar14 * 0x10);
        *puVar1 = *(undefined8 *)(piVar9 + -10);
        puVar1[1] = uVar5;
        *(long *)((long)alStack_428 + lVar12 + lVar14 * 8) = lVar8 - local_4e8[lVar13];
        alStack_4a8[lVar13] = lVar14 + 1;
      }
      if (*piVar9 != 0) {
        lVar8 = alStack_4a8[lVar13];
        lVar3 = *(long *)(piVar9 + -4);
        lVar4 = *(long *)(piVar9 + -2);
        lVar14 = local_468[lVar13];
        auVar17._8_4_ = (int)lVar14;
        auVar17._0_8_ = lVar14;
        auVar17._12_4_ = (int)((ulong)lVar14 >> 0x20);
        plVar2 = (long *)((long)alStack_378 + lVar12 * 2 + lVar8 * 0x10);
        *plVar2 = *(long *)(piVar9 + -4) - lVar14;
        plVar2[1] = lVar4 - auVar17._8_8_;
        *(long *)((long)alStack_428 + lVar12 + lVar8 * 8) = lVar3 - local_4e8[lVar13];
        alStack_4a8[lVar13] = lVar8 + 1;
      }
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x18;
      piVar9 = piVar9 + 0x12;
    } while (local_540 != lVar13);
    iVar10 = 1;
  }
LAB_0011c44e:
  if (iVar10 == 100) {
    if (op_code == 3) {
      pnga_acc(g_a,lo,hi,buf,ld,local_530);
    }
    else if (op_code == 2) {
      pnga_put(g_a,lo,hi,buf,ld);
    }
    else if (op_code == 1) {
      pnga_get(g_a,lo,hi,buf,ld);
    }
    else {
      pnga_error("This operation is invalid ",0);
    }
  }
  else {
    if (iVar10 == 0) {
      pnga_error("g_a indices are invalid ",0);
    }
    if (0 < local_540) {
      memset(&local_528,0,local_540 << 2);
    }
    bVar6 = false;
    do {
      if (local_540 < 1) {
        lVar12 = 0;
      }
      else {
        lVar13 = 0;
        lVar12 = 0;
        do {
          iVar10 = *(int *)((long)&local_528 + lVar13 * 4);
          lVar14 = alStack_428[lVar13 * 3 + (long)iVar10];
          local_228[lVar13] = alStack_378[lVar13 * 6 + (long)iVar10 * 2];
          local_4e8[lVar13] = alStack_378[lVar13 * 6 + (long)(iVar10 * 2 + 1)];
          if (lVar13 != 0) {
            lVar8 = 0;
            do {
              lVar14 = lVar14 * ld[lVar8];
              lVar8 = lVar8 + 1;
            } while (lVar13 != lVar8);
          }
          lVar12 = lVar12 + lVar14;
          lVar13 = lVar13 + 1;
        } while (lVar13 != local_540);
      }
      if (op_code == 3) {
        pnga_acc(g_a,local_228,local_4e8,
                 (void *)(lVar12 * *(long *)(BYTE_ARRAY_001d3571 + local_538 * 0x10 + 0x37) +
                         (long)buf),ld,local_530);
      }
      else if (op_code == 2) {
        pnga_put(g_a,local_228,local_4e8,
                 (void *)(lVar12 * *(long *)(BYTE_ARRAY_001d3571 + local_538 * 0x10 + 0x37) +
                         (long)buf),ld);
      }
      else if (op_code == 1) {
        pnga_get(g_a,local_228,local_4e8,
                 (void *)(lVar12 * *(long *)(BYTE_ARRAY_001d3571 + local_538 * 0x10 + 0x37) +
                         (long)buf),ld);
      }
      else {
        pnga_error("This operation is invalid ",0);
      }
      local_528._0_4_ = (int)local_528 + 1;
      if (0 < local_540) {
        lVar12 = 0;
        do {
          if (alStack_4a8[lVar12] == (long)*(int *)((long)&local_528 + lVar12 * 4)) {
            *(undefined4 *)((long)&local_528 + lVar12 * 4) = 0;
            if (local_540 + -1 == lVar12) {
              bVar6 = true;
              break;
            }
            piVar9 = (int *)((long)&local_528 + lVar12 * 4 + 4);
            *piVar9 = *piVar9 + 1;
          }
          lVar12 = lVar12 + 1;
        } while (local_540 != lVar12);
      }
    } while (!bVar6);
  }
  return;
}

Assistant:

void pnga_periodic(Integer g_a, Integer *lo, Integer *hi, void *buf,
                    Integer *ld, void *alpha, Integer op_code)
{
    int i, j, counter[MAXDIM], done;
    Integer type, ndim, dims[MAXDIM];
    Integer range[MAXDIM][RANGE_BOUND], range_num[MAXDIM];
    Integer offset[MAXDIM][RANGE_BOUND/2], my_offset, temp_offset;
    Integer lop[MAXDIM], hip[MAXDIM];
    int get_range;
    
    pnga_inquire(g_a, &type, &ndim, dims);

    get_range = ngai_peri_get_range_(ndim, dims, lo, hi, range, range_num,
                                     offset, op_code);
    
    if(!get_range) pnga_error("g_a indices are invalid ", 0L);

    /* If this is a regular patch, not periodic operation needed */
    if(get_range == IS_REGULAR_PATCH) {
        switch(op_code) {
          case PERIODIC_GET:
              pnga_get(g_a, lo, hi, buf, ld);
              break;
          case PERIODIC_PUT:
              pnga_put(g_a, lo, hi, buf, ld);
              break;
          case PERIODIC_ACC:    
              pnga_acc(g_a, lo, hi, buf, ld, alpha);
              break;
          default:
              pnga_error("This operation is invalid ", 0L);
        }
        return;
    }

    /* periodic operation continues */
    for(i=0; i<ndim; i++) counter[i] = 0;

    done = 0;
    do {
        my_offset = 0;
        
        for(i=0; i<ndim; i++) {
            lop[i] = range[i][counter[i]*2];
            hip[i] = range[i][counter[i]*2+1];

            /* calculate the offset */
            if(i == 0) my_offset += offset[i][counter[i]];
            else {
                temp_offset = offset[i][counter[i]];
                for(j=0; j<i; j++)
                    /* temp_offset *= dims[j]; */
                    temp_offset *= ld[j];
                my_offset += temp_offset;
            }
        }
        
        /* deal with this patch */
        switch(op_code) {
          case PERIODIC_GET:
              pnga_get(g_a, lop, hip,
                       (char *)buf+my_offset*GAsizeofM(type), ld);
              break;
          case PERIODIC_PUT:
              pnga_put(g_a, lop, hip,
                       (char *)buf+my_offset*GAsizeofM(type), ld);
              break;
          case PERIODIC_ACC:
              pnga_acc(g_a, lop, hip,
                       (char *)buf+my_offset*GAsizeofM(type), ld, alpha);
              break;
          default:
              pnga_error("This operation is invalid ", 0L);
        }      

        counter[0]++;
        for(i=0; i<ndim; i++) {
            if(counter[i] == range_num[i]) {
                counter[i] = 0;
                if(i == (ndim-1)) { done = 1; break; }
                else counter[i+1]++;
            }
        }
    } while(!done);
}